

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_packet_socket.c
# Opt level: O2

int oonf_packet_send(oonf_packet_socket *pktsocket,netaddr_socket *remote,void *data,size_t length)

{
  uint32_t *puVar1;
  autobuf *autobuf;
  oonf_log_source oVar2;
  uint uVar3;
  ssize_t sVar4;
  char *pcVar5;
  uint *puVar6;
  uint64_t uVar7;
  ulong uVar8;
  char *pcVar9;
  uint64_t uVar10;
  char *pcVar11;
  byte bVar12;
  int __flags;
  int iVar13;
  uint uVar14;
  long lVar15;
  char *format;
  netaddr_str buf;
  
  if ((pktsocket->out)._len != 0) {
LAB_001116fb:
    autobuf = &pktsocket->out;
    abuf_memcpy(autobuf,remote,0x80);
    buf.buf._0_2_ = SUB82(length,0);
    abuf_memcpy(autobuf,&buf,2);
    abuf_memcpy(autobuf,data,length);
    oonf_socket_set_write(&pktsocket->scheduler_entry,true);
    return 0;
  }
  __flags = (uint)(pktsocket->config).dont_route << 2;
  iVar13 = (pktsocket->scheduler_entry).fd.fd;
  if (remote == (netaddr_socket *)0x0) {
    sVar4 = send(iVar13,data,length,__flags);
  }
  else {
    sVar4 = sendto(iVar13,data,length,__flags,(sockaddr *)&remote->v4,0x80);
  }
  oVar2 = _oonf_packet_socket_subsystem.logging;
  if (0 < (int)sVar4) {
    if ((log_global_mask[_oonf_packet_socket_subsystem.logging] & 1) != 0) {
      pcVar5 = netaddr_socket_to_string(&buf,remote);
      pcVar9 = "";
      if (pktsocket->os_if != (os_interface *)0x0) {
        pcVar9 = pktsocket->os_if->name;
      }
      oonf_log(LOG_SEVERITY_DEBUG,oVar2,"src/base/oonf_packet_socket.c",0xe6,(void *)0x0,0,
               "Sent %d bytes to %s %s",sVar4,pcVar5,pcVar9);
    }
    puVar1 = &(pktsocket->scheduler_entry)._stat_send;
    *puVar1 = *puVar1 + 1;
    return 0;
  }
  puVar6 = (uint *)__errno_location();
  oVar2 = _oonf_packet_socket_subsystem.logging;
  uVar14 = *puVar6;
  if ((uVar14 == 0xb) || (uVar14 == 4)) goto LAB_001116fb;
  if (uVar14 != 1) {
    if ((log_global_mask[_oonf_packet_socket_subsystem.logging] & 4) != 0) {
      pcVar9 = netaddr_socket_to_string(&buf,remote);
      pcVar5 = strerror(*puVar6);
      oonf_log(LOG_SEVERITY_WARN,oVar2,"src/base/oonf_packet_socket.c",0xf1,(void *)0x0,0,
               "Cannot send UDP packet to %s: %s (%d)",pcVar9,pcVar5,(ulong)*puVar6);
      return -1;
    }
    return -1;
  }
  uVar10 = pktsocket->_errno1_measurement_time;
  uVar7 = oonf_clock_getNow();
  lVar15 = uVar10 - uVar7;
  uVar14 = pktsocket->_errno1_count;
  if (lVar15 < -59999) {
    uVar8 = (ulong)uVar14 / ((ulong)-lVar15 / 60000);
    pktsocket->_errno1_count = uVar14 + 1;
    if ((pktsocket->_errno1_suppression == true) && (uVar8 < 5)) {
      pktsocket->_errno1_suppression = false;
    }
    else if ((pktsocket->_errno1_suppression == false) && (10 < uVar8)) goto LAB_00111932;
  }
  else {
    uVar3 = uVar14 + 1;
    pktsocket->_errno1_count = uVar3;
    bVar12 = pktsocket->_errno1_suppression;
    if (uVar14 < 0xb || (bVar12 & 1) != 0) goto LAB_0011195b;
LAB_00111932:
    pktsocket->_errno1_suppression = true;
    uVar14 = 0;
  }
  uVar10 = oonf_clock_getNow();
  pktsocket->_errno1_measurement_time = uVar10;
  pktsocket->_errno1_count = 1;
  bVar12 = pktsocket->_errno1_suppression;
  uVar3 = 1;
LAB_0011195b:
  oVar2 = _oonf_packet_socket_subsystem.logging;
  pcVar9 = "-";
  if (pktsocket->os_if != (os_interface *)0x0) {
    pcVar9 = pktsocket->os_if->name;
  }
  if ((uVar14 != 0 & bVar12) == 1) {
    if (1 < uVar3) {
      return -1;
    }
    if ((log_global_mask[_oonf_packet_socket_subsystem.logging] & 4) == 0) {
      return -1;
    }
    pcVar5 = netaddr_socket_to_string(&buf,remote);
    pcVar11 = strerror(*puVar6);
    uVar14 = *puVar6;
    iVar13 = 0x1fb;
    format = "Cannot send UDP packet to %s (%s): %s (%d) (%d similar errors suppressed)";
  }
  else {
    if ((log_global_mask[_oonf_packet_socket_subsystem.logging] & 4) == 0) {
      return -1;
    }
    pcVar5 = netaddr_socket_to_string(&buf,remote);
    pcVar11 = strerror(*puVar6);
    uVar14 = *puVar6;
    iVar13 = 0x1ff;
    format = "Cannot send UDP packet to %s (%s): %s (%d)";
  }
  oonf_log(LOG_SEVERITY_WARN,oVar2,"src/base/oonf_packet_socket.c",iVar13,(void *)0x0,0,format,
           pcVar5,pcVar9,pcVar11,(ulong)uVar14);
  return -1;
}

Assistant:

int
oonf_packet_send(struct oonf_packet_socket *pktsocket, union netaddr_socket *remote, const void *data, size_t length) {
  int result;
  struct netaddr_str buf;

  if (abuf_getlen(&pktsocket->out) == 0) {
    /* no backlog of outgoing packets, try to send directly */
    result = os_fd_sendto(&pktsocket->scheduler_entry.fd, data, length, remote, pktsocket->config.dont_route);
    if (result > 0) {
      /* successful */
      OONF_DEBUG(LOG_PACKET, "Sent %d bytes to %s %s", result, netaddr_socket_to_string(&buf, remote),
        pktsocket->os_if != NULL ? pktsocket->os_if->name : "");
      oonf_socket_register_direct_send(&pktsocket->scheduler_entry);
      return 0;
    }

    if (errno == EPERM) {
      _handle_errno1(pktsocket, remote);
      return -1;
    }
    if (errno != EINTR && errno != EAGAIN && errno != EWOULDBLOCK) {
      OONF_WARN(LOG_PACKET, "Cannot send UDP packet to %s: %s (%d)", netaddr_socket_to_string(&buf, remote),
        strerror(errno), errno);
      return -1;
    }
  }

  /* append destination */
  abuf_memcpy(&pktsocket->out, remote, sizeof(*remote));

  /* append data length */
  abuf_append_uint16(&pktsocket->out, length);

  /* append data */
  abuf_memcpy(&pktsocket->out, data, length);

  /* activate outgoing socket scheduler */
  oonf_socket_set_write(&pktsocket->scheduler_entry, true);
  return 0;
}